

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearrayfactory.cpp
# Opt level: O3

void __thiscall PureArrayFactory::~PureArrayFactory(PureArrayFactory *this)

{
  ~PureArrayFactory(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

PureArrayFactory::~PureArrayFactory()
{
	for (int i = 0; i < _range; ++i) {
		if (_arrays[i])
			delete _arrays[i];
	}

	delete[] _arrays;
}